

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::SnapshotEventLogEntry_Parse
               (EventLogEntry *evt,ThreadContext *threadContext,FileReader *reader,
               UnlinkableSlabAllocator *alloc)

{
  uint32 uVar1;
  int iVar2;
  SnapshotEventLogEntry *pSVar3;
  int64 iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TTD_LOG_PTR_ID *local_48;
  TTD_LOG_PTR_ID *local_40;
  uint local_38;
  uint local_34;
  uint32 i_1;
  uint32 i;
  SnapshotEventLogEntry *snapEvt;
  UnlinkableSlabAllocator *alloc_local;
  FileReader *reader_local;
  ThreadContext *threadContext_local;
  EventLogEntry *evt_local;
  
  pSVar3 = GetInlineEventDataAs<TTD::NSLogEvents::SnapshotEventLogEntry,(TTD::NSLogEvents::EventKind)1>
                     (evt);
  iVar4 = FileReader::ReadInt64(reader,restoreTime,true);
  pSVar3->RestoreTimestamp = iVar4;
  uVar1 = FileReader::ReadLengthValue(reader,true);
  pSVar3->LiveContextCount = uVar1;
  if (pSVar3->LiveContextCount == 0) {
    local_40 = (TTD_LOG_PTR_ID *)0x0;
  }
  else {
    local_40 = SlabAllocatorBase<8>::SlabAllocateArray<unsigned_long>
                         (alloc,(ulong)pSVar3->LiveContextCount);
  }
  pSVar3->LiveContextIdArray = local_40;
  FileReader::ReadSequenceStart_WDefaultKey(reader,true);
  for (local_34 = 0; local_34 < pSVar3->LiveContextCount; local_34 = local_34 + 1) {
    iVar2 = (*reader->_vptr_FileReader[0x11])(reader,(ulong)(local_34 != 0));
    pSVar3->LiveContextIdArray[local_34] = CONCAT44(extraout_var,iVar2);
  }
  (*reader->_vptr_FileReader[5])();
  uVar1 = FileReader::ReadLengthValue(reader,true);
  pSVar3->LongLivedRefRootsCount = uVar1;
  if (pSVar3->LongLivedRefRootsCount == 0) {
    local_48 = (TTD_LOG_PTR_ID *)0x0;
  }
  else {
    local_48 = SlabAllocatorBase<8>::SlabAllocateArray<unsigned_long>
                         (alloc,(ulong)pSVar3->LongLivedRefRootsCount);
  }
  pSVar3->LongLivedRefRootsIdArray = local_48;
  FileReader::ReadSequenceStart_WDefaultKey(reader,true);
  for (local_38 = 0; local_38 < pSVar3->LongLivedRefRootsCount; local_38 = local_38 + 1) {
    iVar2 = (*reader->_vptr_FileReader[0x11])(reader,(ulong)(local_38 != 0));
    pSVar3->LongLivedRefRootsIdArray[local_38] = CONCAT44(extraout_var_00,iVar2);
  }
  (*reader->_vptr_FileReader[5])();
  pSVar3->Snap = (SnapShot *)0x0;
  return;
}

Assistant:

void SnapshotEventLogEntry_Parse(EventLogEntry* evt, ThreadContext* threadContext, FileReader* reader, UnlinkableSlabAllocator& alloc)
        {
            SnapshotEventLogEntry* snapEvt = GetInlineEventDataAs<SnapshotEventLogEntry, EventKind::SnapshotTag>(evt);

            snapEvt->RestoreTimestamp = reader->ReadInt64(NSTokens::Key::restoreTime, true);

            snapEvt->LiveContextCount = reader->ReadLengthValue(true);
            snapEvt->LiveContextIdArray = (snapEvt->LiveContextCount != 0) ? alloc.SlabAllocateArray<TTD_LOG_PTR_ID>(snapEvt->LiveContextCount) : nullptr;

            reader->ReadSequenceStart_WDefaultKey(true);
            for(uint32 i = 0; i < snapEvt->LiveContextCount; ++i)
            {
                snapEvt->LiveContextIdArray[i] = reader->ReadNakedLogTag(i != 0);
            }
            reader->ReadSequenceEnd();

            snapEvt->LongLivedRefRootsCount = reader->ReadLengthValue(true);
            snapEvt->LongLivedRefRootsIdArray = (snapEvt->LongLivedRefRootsCount != 0) ? alloc.SlabAllocateArray<TTD_LOG_PTR_ID>(snapEvt->LongLivedRefRootsCount) : nullptr;

            reader->ReadSequenceStart_WDefaultKey(true);
            for(uint32 i = 0; i < snapEvt->LongLivedRefRootsCount; ++i)
            {
                snapEvt->LongLivedRefRootsIdArray[i] = reader->ReadNakedLogTag(i != 0);
            }
            reader->ReadSequenceEnd();

            snapEvt->Snap = nullptr;
        }